

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O2

void __thiscall cmInstalledFile::SetName(cmInstalledFile *this,cmMakefile *mf,string *name)

{
  undefined1 auVar1 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  undefined1 local_58 [8];
  undefined1 local_50 [32];
  
  cmMakefile::GetBacktrace((cmMakefile *)&stack0xffffffffffffffd0);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             (local_50 + 0x10),
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffd0);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_50,(cmListFileBacktrace *)(local_50 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x18));
  std::__cxx11::string::_M_assign((string *)this);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_58,(string *)local_50);
  auVar1 = local_58;
  local_58 = (undefined1  [8])0x0;
  this->NameExpression = (cmCompiledGeneratorExpression *)auVar1;
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_58);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void cmInstalledFile::SetName(cmMakefile* mf, const std::string& name)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(backtrace);

  this->Name = name;
  this->NameExpression = ge.Parse(name).release();
}